

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O1

uint64_t check_num_bits_u64(uint32_t bs,uint64_t *b)

{
  ulong *puVar1;
  uint64_t b_00;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  uint64_t uVar6;
  void *__s;
  uint32_t i;
  ulong uVar7;
  undefined8 uStack_60;
  ulong uStack_58;
  uint64_t *local_50;
  ulong local_48;
  void *local_40;
  undefined1 *local_38;
  
  local_38 = (undefined1 *)&uStack_58;
  uVar5 = (bs - 1 >> 6) + 1;
  uVar6 = 0xffffffffffffffff;
  if (uVar5 * 0x40 != bs) {
    local_48 = (ulong)uVar5;
    lVar2 = -(ulong)(uVar5 * 8 + 0xf & 0xfffffff0);
    __s = (void *)((long)&uStack_58 + lVar2);
    uVar7 = 0;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x16af31;
    memset(__s,0,(ulong)(uVar5 * 8));
    local_40 = __s;
    puVar1 = (ulong *)((long)__s + (ulong)(bs >> 6) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)bs & 0x3f);
    uVar6 = 0;
    local_50 = b;
    do {
      uVar4 = local_50[uVar7];
      b_00 = *(uint64_t *)((long)local_40 + uVar7 * 8);
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x16af68;
      uVar3 = FStar_UInt64_eq_mask(uVar4,b_00);
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x16af76;
      uVar4 = FStar_UInt64_gte_mask(uVar4,b_00);
      uVar6 = ~(uVar4 | uVar3) | uVar6 & uVar3;
      uVar7 = uVar7 + 1;
    } while (local_48 != uVar7);
  }
  return uVar6;
}

Assistant:

static inline uint64_t check_num_bits_u64(uint32_t bs, uint64_t *b)
{
  uint32_t bLen = (bs - 1U) / 64U + 1U;
  if (bs == 64U * bLen)
  {
    return 0xFFFFFFFFFFFFFFFFULL;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), bLen);
  uint64_t b2[bLen];
  memset(b2, 0U, bLen * sizeof (uint64_t));
  uint32_t i0 = bs / 64U;
  uint32_t j = bs % 64U;
  b2[i0] = b2[i0] | 1ULL << j;
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < bLen; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(b[i], b2[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(b[i], b2[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  uint64_t res = acc;
  return res;
}